

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O3

string * __thiscall
(anonymous_namespace)::OriginPubkeyProvider::ToString_abi_cxx11_
          (string *__return_storage_ptr__,void *this,StringType type)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  undefined8 uVar5;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  OriginString_abi_cxx11_(&local_90,this,type,false);
  pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_90,0,0,"[",1);
  local_70._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
  paVar3 = &pbVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == paVar3) {
    local_70.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
    local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
  }
  local_70._M_string_length = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_70,"]");
  paVar3 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
  paVar4 = &pbVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == paVar4) {
    local_50.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_50.field_2._8_4_ = *(undefined4 *)((long)&pbVar2->field_2 + 8);
    local_50.field_2._12_4_ = *(undefined4 *)((long)&pbVar2->field_2 + 0xc);
    local_50._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_50.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_50._M_string_length = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  (**(code **)(**(long **)((long)this + 0x30) + 0x28))(&local_b0,*(long **)((long)this + 0x30),type)
  ;
  uVar5 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar3) {
    uVar5 = local_50.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar5 < local_b0._M_string_length + local_50._M_string_length) {
    uVar5 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar5 = local_b0.field_2._M_allocated_capacity;
    }
    if (local_b0._M_string_length + local_50._M_string_length <= (ulong)uVar5) {
      pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_b0,0,0,local_50._M_dataplus._M_p,local_50._M_string_length);
      goto LAB_00daed46;
    }
  }
  pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_50,local_b0._M_dataplus._M_p,local_b0._M_string_length);
LAB_00daed46:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (pbVar2->_M_dataplus)._M_p;
  paVar4 = &pbVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar4) {
    uVar5 = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar4->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar5;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar2->_M_string_length = 0;
  paVar4->_M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar3) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string ToString(StringType type) const override { return "[" + OriginString(type) + "]" + m_provider->ToString(type); }